

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

int conf_get_int(Conf *conf,int primary)

{
  void *pvVar1;
  conf_entry *entry;
  key key;
  int primary_local;
  Conf *conf_local;
  
  key.secondary._4_4_ = primary;
  if (subkeytypes[primary] != 0) {
    __assert_fail("subkeytypes[primary] == TYPE_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x11b,"int conf_get_int(Conf *, int)");
  }
  if (valuetypes[primary] == 2) {
    entry._0_4_ = primary;
    pvVar1 = find234(conf->tree,&entry,(cmpfn234)0x0);
    if (pvVar1 != (void *)0x0) {
      return *(int *)((long)pvVar1 + 0x10);
    }
    __assert_fail("entry",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                  0x11f,"int conf_get_int(Conf *, int)");
  }
  __assert_fail("valuetypes[primary] == TYPE_INT",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/conf.c",
                0x11c,"int conf_get_int(Conf *, int)");
}

Assistant:

int conf_get_int(Conf *conf, int primary)
{
    struct key key;
    struct conf_entry *entry;

    assert(subkeytypes[primary] == TYPE_NONE);
    assert(valuetypes[primary] == TYPE_INT);
    key.primary = primary;
    entry = find234(conf->tree, &key, NULL);
    assert(entry);
    return entry->value.u.intval;
}